

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmStrCat<char[75],std::__cxx11::string,char[30],std::__cxx11::string,char[17]>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,char (*args) [75],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
                   char (*args_2) [30],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
                   char (*args_4) [17])

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  cmAlphaNum local_1a8;
  cmAlphaNum local_178;
  cmAlphaNum local_148;
  cmAlphaNum local_118;
  cmAlphaNum local_e8;
  string_view local_b8;
  string_view local_a8;
  string_view local_98;
  string_view local_88;
  string_view local_78;
  string_view local_68;
  string_view local_58;
  iterator local_48;
  undefined8 local_40;
  char (*local_38) [30];
  char (*args_local_2) [30];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  char (*args_local) [75];
  cmAlphaNum *b_local;
  cmAlphaNum *a_local;
  
  local_38 = args_2;
  args_local_2 = (char (*) [30])args_1;
  args_local_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args;
  args_local = (char (*) [75])b;
  b_local = a;
  a_local = (cmAlphaNum *)__return_storage_ptr__;
  local_b8 = cmAlphaNum::View(a);
  local_a8 = cmAlphaNum::View((cmAlphaNum *)args_local);
  cmAlphaNum::cmAlphaNum(&local_e8,(char *)args_local_1);
  local_98 = cmAlphaNum::View(&local_e8);
  cmAlphaNum::cmAlphaNum(&local_118,(string *)args_local_2);
  local_88 = cmAlphaNum::View(&local_118);
  cmAlphaNum::cmAlphaNum(&local_148,*local_38);
  local_78 = cmAlphaNum::View(&local_148);
  cmAlphaNum::cmAlphaNum(&local_178,args_3);
  local_68 = cmAlphaNum::View(&local_178);
  cmAlphaNum::cmAlphaNum(&local_1a8,*args_4);
  local_58 = cmAlphaNum::View(&local_1a8);
  local_48 = &local_b8;
  local_40 = 7;
  views._M_len = 7;
  views._M_array = local_48;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}